

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

void namelist2gui(char *name,t_namelist *namelist)

{
  char **ppcVar1;
  void *pvVar2;
  char **newnames;
  size_t newsize;
  char **names;
  size_t namesize;
  t_namelist *nl;
  int i;
  size_t allocchunk;
  t_namelist *namelist_local;
  char *name_local;
  
  names = (char **)0x20;
  newsize = (size_t)getbytes(0x100);
  nl._4_4_ = 0;
  for (namesize = (size_t)namelist; namesize != 0; namesize = *(size_t *)namesize) {
    pvVar2 = (void *)newsize;
    ppcVar1 = names;
    if (names <= (char **)(long)(int)nl._4_4_) {
      pvVar2 = resizebytes((void *)newsize,(long)names << 3,(long)(names + 4) * 8);
      ppcVar1 = names + 4;
      if (pvVar2 == (void *)0x0) break;
    }
    names = ppcVar1;
    newsize = (size_t)pvVar2;
    *(undefined8 *)(newsize + (long)(int)nl._4_4_ * 8) = *(undefined8 *)(namesize + 8);
    nl._4_4_ = nl._4_4_ + 1;
  }
  pdgui_vmess("set","rS",name,(ulong)nl._4_4_,newsize);
  freebytes((void *)newsize,(long)names << 3);
  return;
}

Assistant:

static void namelist2gui(const char*name, t_namelist*namelist)
{
    const size_t allocchunk = 32;
    int i;
    t_namelist *nl;

    size_t namesize = allocchunk;
    const char**names=(const char**)getbytes(namesize*sizeof(const char*));

    for (nl = namelist, i = 0; nl; nl = nl->nl_next, i++)
    {
        if(i>=namesize) {
            size_t newsize = namesize + allocchunk;
            const char**newnames = (const char**)resizebytes(
                names,
                namesize*sizeof(const char*),
                newsize*sizeof(const char*));
            if (!newnames)
                break;
            names = newnames;
            namesize = newsize;
        }
        names[i] = nl->nl_string;
    }
    pdgui_vmess("set", "rS",
              name,
              i, names);
    freebytes(names, namesize*sizeof(const char*));
}